

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

bool Omega_h::is_sorted<double>(Read<double> *a)

{
  Alloc *pAVar1;
  bool bVar2;
  int iVar3;
  type transform;
  
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    iVar3 = (int)(pAVar1->size >> 3);
  }
  else {
    iVar3 = (int)((ulong)pAVar1 >> 6);
  }
  bVar2 = true;
  if (1 < iVar3) {
    Write<double>::Write((Write<double> *)&transform,&a->write_);
    bVar2 = transform_reduce<Omega_h::IntIterator,Omega_h::is_sorted<double>(Omega_h::Read<double>)::_lambda(int)_1_,bool,Omega_h::logical_and<bool>>
                      (0,iVar3 + -1,1,&transform);
    Write<double>::~Write((Write<double> *)&transform);
  }
  return bVar2;
}

Assistant:

bool is_sorted(Read<T> a) {
  if (a.size() < 2) return true;
  auto const first = IntIterator(0);
  auto const last = IntIterator(a.size() - 1);
  auto const init = true;
  auto const op = logical_and<bool>();
  auto transform = OMEGA_H_LAMBDA(LO i)->bool { return a[i] <= a[i + 1]; };
  return transform_reduce(first, last, init, op, std::move(transform));
}